

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_destructuring_element
              (JSParseState *s,int tok,int is_arg,int hasval,int has_ellipsis,BOOL allow_initializer
              )

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  JSContext *in_RDI;
  uint in_R8D;
  int in_R9D;
  BOOL in_stack_0000003c;
  int *in_stack_00000040;
  JSParseState *in_stack_00000048;
  int label_hasval_1;
  BlockEnv block_env;
  int enum_depth;
  BOOL has_spread;
  int label_hasval;
  int prop_type;
  BOOL has_initializer;
  int skip_bits;
  int tok1;
  int scope;
  int opcode;
  JSAtom var_name;
  JSAtom prop_name;
  int assign_addr;
  int start_addr;
  int depth_lvalue;
  int label_lvalue;
  int label_done;
  int label_assign;
  int label_parse;
  uint in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  uint8_t in_stack_fffffffffffffeff;
  int in_stack_ffffffffffffff00;
  JSAtom in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  JSAtom in_stack_ffffffffffffff0c;
  uint8_t uVar8;
  JSContext *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  PutLValueEnum in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  JSAtom in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  undefined3 uVar9;
  uint in_stack_ffffffffffffff2c;
  JSContext *in_stack_ffffffffffffff30;
  PutLValueEnum in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  JSAtom in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  JSParseState *in_stack_ffffffffffffff58;
  JSAtom in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int local_5c;
  uint local_58;
  int local_50;
  PutLValueEnum local_4c;
  JSAtom local_48;
  int local_44;
  int local_34;
  int local_4;
  
  if ((int)in_R8D < 0) {
    js_parse_skip_parens_token(in_stack_00000048,in_stack_00000040,in_stack_0000003c);
    in_R8D = local_58 & 2;
  }
  iVar3 = new_label((JSParseState *)0x192483);
  iVar4 = new_label((JSParseState *)0x192497);
  iVar5 = (int)*(undefined8 *)((long)(in_RDI->array_ctor).u.ptr + 0x138);
  if (in_ECX == 0) {
    emit_goto((JSParseState *)
              CONCAT17(in_stack_fffffffffffffeff,
                       CONCAT16(in_stack_fffffffffffffefe,
                                CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),0,
              0x192540);
    emit_label((JSParseState *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,
                                 CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),0);
    emit_op((JSParseState *)in_stack_ffffffffffffff10,(uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
  }
  else {
    emit_op((JSParseState *)in_stack_ffffffffffffff10,(uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
    emit_op((JSParseState *)in_stack_ffffffffffffff10,(uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
    emit_op((JSParseState *)in_stack_ffffffffffffff10,(uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
    emit_goto((JSParseState *)
              CONCAT17(in_stack_fffffffffffffeff,
                       CONCAT16(in_stack_fffffffffffffefe,
                                CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),0,
              0x192511);
    emit_label((JSParseState *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,
                                 CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),0);
  }
  uVar1 = *(undefined8 *)((long)(in_RDI->array_ctor).u.ptr + 0x138);
  if (*(int *)&in_RDI->rt == 0x7b) {
    iVar6 = next_token(in_stack_ffffffffffffff58);
    if (iVar6 == 0) {
      emit_op((JSParseState *)in_stack_ffffffffffffff10,(uint8_t)(in_stack_ffffffffffffff0c >> 0x18)
             );
      if (in_R8D != 0) {
        emit_op((JSParseState *)in_stack_ffffffffffffff10,
                (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
        emit_op((JSParseState *)in_stack_ffffffffffffff10,
                (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
      }
      while (*(int *)&in_RDI->rt != 0x7d) {
        if (*(int *)&in_RDI->rt == -0x5b) {
          if (in_R8D == 0) {
            JS_ThrowInternalError(*(JSContext **)&in_RDI->header,"unexpected ellipsis token");
            return -1;
          }
          iVar6 = next_token(in_stack_ffffffffffffff58);
          if (iVar6 != 0) {
            return -1;
          }
          if (in_ESI == 0) {
            iVar6 = js_parse_left_hand_side_expr((JSParseState *)0x19270e);
            if (iVar6 != 0) {
              return -1;
            }
            in_stack_fffffffffffffef8 = 0;
            in_stack_ffffffffffffff00 = 0x7b;
            iVar6 = get_lvalue((JSParseState *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                               (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (JSAtom *)in_stack_ffffffffffffff30,
                               (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
            if (iVar6 != 0) {
              return -1;
            }
          }
          else {
            local_48 = js_parse_destructuring_var
                                 ((JSParseState *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                  in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
            if (local_48 == 0) {
              return -1;
            }
            local_4c = 0xb6;
            local_50 = *(int *)((long)(in_RDI->array_ctor).u.ptr + 0xe0);
            local_34 = -1;
          }
          if (*(int *)&in_RDI->rt != 0x7d) {
            js_parse_error((JSParseState *)in_RDI,"assignment rest property must be last");
            goto LAB_00193931;
          }
          emit_op((JSParseState *)in_stack_ffffffffffffff10,
                  (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
          emit_op((JSParseState *)in_stack_ffffffffffffff10,
                  (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
          emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  in_stack_fffffffffffffeff);
LAB_00192ef9:
          in_stack_ffffffffffffff30 = in_RDI;
          if (in_ESI != 0) {
            iVar6 = js_define_var((JSParseState *)
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                  (JSAtom)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                  (int)in_stack_ffffffffffffff10);
            if (iVar6 != 0) goto LAB_00193931;
            local_50 = *(int *)((long)(in_RDI->array_ctor).u.ptr + 0xe0);
            in_stack_ffffffffffffff30 = in_RDI;
          }
          if (*(int *)&in_stack_ffffffffffffff30->rt == 0x3d) {
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_goto((JSParseState *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,
                                        CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ))),0,0x192fa0);
            iVar6 = next_token(in_stack_ffffffffffffff58);
            if (iVar6 != 0) goto LAB_00193931;
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            iVar6 = js_parse_assign_expr((JSParseState *)0x192fdd);
            if (iVar6 != 0) goto LAB_00193931;
            if ((local_4c == 0xb6) || (local_4c == 0x3c)) {
              set_object_name((JSParseState *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff1c);
            }
            emit_label((JSParseState *)
                       CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,
                                         CONCAT24(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8))),0);
          }
          uVar9 = (undefined3)in_stack_ffffffffffffff48;
          in_stack_ffffffffffffff48 = CONCAT13(1,uVar9);
          if (in_ESI != -0x37) {
            in_stack_ffffffffffffff48 = CONCAT13(in_ESI == -0x2f,uVar9);
          }
          in_stack_fffffffffffffef8 = in_stack_ffffffffffffff48 >> 0x18;
          in_stack_ffffffffffffff38 = local_4c;
          in_stack_ffffffffffffff3c = local_50;
          in_stack_ffffffffffffff40 = local_48;
          in_stack_ffffffffffffff44 = local_34;
          in_RDI = in_stack_ffffffffffffff30;
          put_lvalue((JSParseState *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff1c,local_48);
          if (*(int *)&in_RDI->rt == 0x7d) break;
          iVar6 = js_parse_expect((JSParseState *)
                                  CONCAT17(in_stack_fffffffffffffeff,
                                           CONCAT16(in_stack_fffffffffffffefe,
                                                    CONCAT24(in_stack_fffffffffffffefc,
                                                             in_stack_fffffffffffffef8))),0);
          if (iVar6 != 0) {
            return -1;
          }
        }
        else {
          iVar6 = js_parse_property_name
                            ((JSParseState *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (JSAtom *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                             in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
          if (iVar6 < 0) {
            return -1;
          }
          local_48 = 0;
          local_4c = 0xb6;
          local_50 = *(int *)((long)(in_RDI->array_ctor).u.ptr + 0xe0);
          local_34 = -1;
          if (iVar6 != 0) {
            if ((in_EDX == 0) ||
               (iVar6 = js_parse_check_duplicate_parameter
                                  ((JSParseState *)
                                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                   in_stack_ffffffffffffff04), iVar6 == 0)) {
              if (((*(byte *)((long)(in_RDI->array_ctor).u.ptr + 0x86) & 1) == 0) ||
                 ((local_44 != 0x3a && (local_44 != 0x4d)))) {
                if (in_R8D != 0) {
                  emit_op((JSParseState *)in_stack_ffffffffffffff10,
                          (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                  emit_op((JSParseState *)in_stack_ffffffffffffff10,
                          (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                  emit_op((JSParseState *)in_stack_ffffffffffffff10,
                          (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                  emit_atom((JSParseState *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                            CONCAT13(in_stack_fffffffffffffeff,
                                     CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)))
                  ;
                  emit_op((JSParseState *)in_stack_ffffffffffffff10,
                          (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                }
                if ((in_ESI != 0) && (in_ESI != -0x4f)) {
                  local_48 = JS_DupAtom(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
                  emit_op((JSParseState *)in_stack_ffffffffffffff10,
                          (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                  emit_u32((JSParseState *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           CONCAT13(in_stack_fffffffffffffeff,
                                    CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
                  goto LAB_00192ef9;
                }
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                emit_atom((JSParseState *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          CONCAT13(in_stack_fffffffffffffeff,
                                   CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
                emit_u16((JSParseState *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         CONCAT11(in_stack_fffffffffffffeff,in_stack_fffffffffffffefe));
LAB_00192be9:
                in_stack_fffffffffffffef8 = 0;
                in_stack_ffffffffffffff00 = 0x7b;
                iVar6 = get_lvalue((JSParseState *)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                   (int *)CONCAT44(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40),
                                   (int *)CONCAT44(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38),
                                   (JSAtom *)in_stack_ffffffffffffff30,
                                   (int *)CONCAT44(in_stack_ffffffffffffff2c,
                                                   in_stack_ffffffffffffff28),
                                   (int *)CONCAT44(in_stack_ffffffffffffff24,
                                                   in_stack_ffffffffffffff20),
                                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
                if (iVar6 == 0) {
                  if (local_44 != 0) {
                    in_stack_ffffffffffffff4c = 0;
                  }
                  goto LAB_00192d1f;
                }
              }
              else {
                js_parse_error((JSParseState *)in_RDI,"invalid destructuring target");
              }
            }
LAB_0019391a:
            JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        CONCAT13(in_stack_fffffffffffffeff,
                                 CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
            goto LAB_00193931;
          }
          iVar6 = next_token(in_stack_ffffffffffffff58);
          if (iVar6 != 0) goto LAB_0019391a;
          if (((*(int *)&in_RDI->rt != 0x5b) && (*(int *)&in_RDI->rt != 0x7b)) ||
             ((iVar6 = js_parse_skip_parens_token
                                 (in_stack_00000048,in_stack_00000040,in_stack_0000003c),
              iVar6 != 0x2c && ((iVar6 != 0x3d && (iVar6 != 0x7d)))))) {
            uVar8 = (uint8_t)(in_stack_ffffffffffffff0c >> 0x18);
            if (local_44 == 0) {
              emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
              if (in_R8D != 0) {
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
              }
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            }
            else {
              if (in_R8D != 0) {
                emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
                emit_atom((JSParseState *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          CONCAT13(in_stack_fffffffffffffeff,
                                   CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
                emit_op((JSParseState *)in_stack_ffffffffffffff10,
                        (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
              }
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            }
            if (in_ESI == 0) {
              iVar6 = js_parse_left_hand_side_expr((JSParseState *)0x192bdd);
              if (iVar6 == 0) goto LAB_00192be9;
            }
            else {
              local_48 = js_parse_destructuring_var
                                   ((JSParseState *)
                                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                    in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
              if (local_48 != 0) {
LAB_00192d1f:
                uVar8 = (uint8_t)(in_stack_ffffffffffffff0c >> 0x18);
                if (local_44 == 0) {
                  emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
                }
                else {
                  emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
                  emit_u32((JSParseState *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           CONCAT13(in_stack_fffffffffffffeff,
                                    CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
                }
                goto LAB_00192ef9;
              }
            }
            goto LAB_0019391a;
          }
          uVar8 = (uint8_t)(in_stack_ffffffffffffff0c >> 0x18);
          if (local_44 == 0) {
            if (in_R8D != 0) {
              emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            }
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
          }
          else {
            if (in_R8D != 0) {
              emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
              emit_atom((JSParseState *)
                        CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        CONCAT13(in_stack_fffffffffffffeff,
                                 CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
              emit_op((JSParseState *)in_stack_ffffffffffffff10,
                      (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            }
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_u32((JSParseState *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     CONCAT13(in_stack_fffffffffffffeff,
                              CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
          }
          iVar6 = js_parse_destructuring_element
                            ((JSParseState *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,in_R9D,iVar3,
                             iVar4);
          if (iVar6 < 0) {
            return -1;
          }
          if (*(int *)&in_RDI->rt == 0x7d) break;
          iVar6 = js_parse_expect((JSParseState *)
                                  CONCAT17(in_stack_fffffffffffffeff,
                                           CONCAT16(in_stack_fffffffffffffefe,
                                                    CONCAT24(in_stack_fffffffffffffefc,
                                                             in_stack_fffffffffffffef8))),0);
          if (iVar6 != 0) {
            return -1;
          }
        }
      }
      uVar8 = (uint8_t)(in_stack_ffffffffffffff0c >> 0x18);
      emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
      if (in_R8D != 0) {
        emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
      }
      iVar4 = next_token(in_stack_ffffffffffffff58);
      if (iVar4 != 0) {
        return -1;
      }
LAB_0019377e:
      if ((*(int *)&in_RDI->rt == 0x3d) && (in_R9D != 0)) {
        emit_goto((JSParseState *)
                  CONCAT17(in_stack_fffffffffffffeff,
                           CONCAT16(in_stack_fffffffffffffefe,
                                    CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),
                  0,0x1937b5);
        iVar3 = next_token(in_stack_ffffffffffffff58);
        if (iVar3 != 0) {
          return -1;
        }
        emit_label((JSParseState *)
                   CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,
                                     CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)))
                   ,0);
        if (in_ECX != 0) {
          emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
        }
        iVar3 = js_parse_assign_expr((JSParseState *)0x19381b);
        if (iVar3 != 0) {
          return -1;
        }
        emit_goto((JSParseState *)
                  CONCAT17(in_stack_fffffffffffffeff,
                           CONCAT16(in_stack_fffffffffffffefe,
                                    CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),
                  0,0x193849);
        emit_label((JSParseState *)
                   CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,
                                     CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)))
                   ,0);
        local_5c = 1;
      }
      else {
        if (in_ECX == 0) {
          js_parse_error((JSParseState *)in_RDI,"too complicated destructuring expression");
          return -1;
        }
        memset((void *)(*(long *)((long)(in_RDI->array_ctor).u.ptr + 0x130) + (long)iVar5),0xb1,
               (long)((int)uVar1 - iVar5));
        piVar7 = (int *)(*(long *)((long)(in_RDI->array_ctor).u.ptr + 0x170) + (long)iVar3 * 0x18);
        *piVar7 = *piVar7 + -1;
        local_5c = 0;
      }
      return local_5c;
    }
    local_4 = -1;
  }
  else if (*(int *)&in_RDI->rt == 0x5b) {
    iVar6 = next_token(in_stack_ffffffffffffff58);
    if (iVar6 == 0) {
      push_break_entry((JSFunctionDef *)(in_RDI->array_ctor).u.ptr,
                       (BlockEnv *)&stack0xffffffffffffff58,0,-1,-1,2);
      emit_op((JSParseState *)in_stack_ffffffffffffff10,(uint8_t)(in_stack_ffffffffffffff0c >> 0x18)
             );
      bVar2 = false;
      do {
        if (*(int *)&in_RDI->rt == 0x5d) {
LAB_00193713:
          uVar8 = (uint8_t)(in_stack_ffffffffffffff0c >> 0x18);
          emit_op((JSParseState *)in_stack_ffffffffffffff10,uVar8);
          pop_break_entry((JSFunctionDef *)(in_RDI->array_ctor).u.ptr);
          iVar4 = next_token(in_stack_ffffffffffffff58);
          if (iVar4 != 0) {
            return -1;
          }
          goto LAB_0019377e;
        }
        if (*(int *)&in_RDI->rt == -0x5b) {
          iVar6 = next_token(in_stack_ffffffffffffff58);
          if (iVar6 != 0) {
            return -1;
          }
          if ((*(int *)&in_RDI->rt == 0x2c) || (*(int *)&in_RDI->rt == 0x5d)) {
            iVar3 = js_parse_error((JSParseState *)in_RDI,"missing binding pattern...");
            return iVar3;
          }
          bVar2 = true;
        }
        if (*(int *)&in_RDI->rt == 0x2c) {
          emit_op((JSParseState *)in_stack_ffffffffffffff10,
                  (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
          emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  in_stack_fffffffffffffeff);
          emit_op((JSParseState *)in_stack_ffffffffffffff10,
                  (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
          emit_op((JSParseState *)in_stack_ffffffffffffff10,
                  (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
        }
        else if (((*(int *)&in_RDI->rt == 0x5b) || (*(int *)&in_RDI->rt == 0x7b)) &&
                ((iVar6 = js_parse_skip_parens_token
                                    (in_stack_00000048,in_stack_00000040,in_stack_0000003c),
                 iVar6 == 0x2c || ((iVar6 == 0x3d || (iVar6 == 0x5d)))))) {
          if (bVar2) {
            if (iVar6 == 0x3d) {
              iVar3 = js_parse_error((JSParseState *)in_RDI,
                                     "rest element cannot have a default value");
              return iVar3;
            }
            js_emit_spread_code((JSParseState *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
            ;
          }
          else {
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    in_stack_fffffffffffffeff);
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
          }
          iVar6 = js_parse_destructuring_element
                            ((JSParseState *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,in_R9D,iVar3,
                             iVar4);
          if (iVar6 < 0) {
            return -1;
          }
        }
        else {
          local_48 = 0;
          if (in_ESI == 0) {
            iVar6 = js_parse_left_hand_side_expr((JSParseState *)0x19346a);
            if (iVar6 != 0) {
              return -1;
            }
            in_stack_fffffffffffffef8 = 0;
            in_stack_ffffffffffffff00 = 0x5b;
            iVar6 = get_lvalue((JSParseState *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                               (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (JSAtom *)in_stack_ffffffffffffff30,
                               (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
            if (iVar6 != 0) {
              return -1;
            }
          }
          else {
            local_48 = js_parse_destructuring_var
                                 ((JSParseState *)
                                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                  in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
            if ((local_48 == 0) ||
               (iVar6 = js_define_var((JSParseState *)
                                      CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                      (JSAtom)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                      (int)in_stack_ffffffffffffff10), iVar6 != 0))
            goto LAB_00193931;
            local_4c = 0xb6;
            local_50 = *(int *)((long)(in_RDI->array_ctor).u.ptr + 0xe0);
          }
          if (bVar2) {
            js_emit_spread_code((JSParseState *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
            ;
          }
          else {
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_u8((JSParseState *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                    in_stack_fffffffffffffeff);
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
          }
          if ((*(int *)&in_RDI->rt == 0x3d) && (!bVar2)) {
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            emit_goto((JSParseState *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,
                                        CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ))),0,0x1935a4);
            iVar6 = next_token(in_stack_ffffffffffffff58);
            if (iVar6 != 0) {
LAB_00193931:
              JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                          ,CONCAT13(in_stack_fffffffffffffeff,
                                    CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)));
              return -1;
            }
            emit_op((JSParseState *)in_stack_ffffffffffffff10,
                    (uint8_t)(in_stack_ffffffffffffff0c >> 0x18));
            iVar6 = js_parse_assign_expr((JSParseState *)0x1935de);
            if (iVar6 != 0) goto LAB_00193931;
            if ((local_4c == 0xb6) || (local_4c == 0x3c)) {
              set_object_name((JSParseState *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              in_stack_ffffffffffffff1c);
            }
            emit_label((JSParseState *)
                       CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,
                                         CONCAT24(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8))),0);
          }
          in_stack_ffffffffffffff10 = in_RDI;
          uVar9 = (undefined3)in_stack_ffffffffffffff2c;
          in_stack_ffffffffffffff2c = CONCAT13(1,uVar9);
          if (in_ESI != -0x37) {
            in_stack_ffffffffffffff2c = CONCAT13(in_ESI == -0x2f,uVar9);
          }
          in_stack_fffffffffffffef8 = in_stack_ffffffffffffff2c >> 0x18;
          in_stack_ffffffffffffff1c = local_4c;
          in_stack_ffffffffffffff20 = local_50;
          in_stack_ffffffffffffff28 = local_34;
          in_RDI = in_stack_ffffffffffffff10;
          put_lvalue((JSParseState *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,local_34,
                     local_48,local_50,local_4c,in_stack_ffffffffffffff40);
          in_stack_ffffffffffffff24 = local_48;
        }
        if (*(int *)&in_RDI->rt == 0x5d) goto LAB_00193713;
        if (bVar2) {
          iVar3 = js_parse_error((JSParseState *)in_RDI,"rest element must be the last one");
          return iVar3;
        }
        iVar6 = js_parse_expect((JSParseState *)
                                CONCAT17(in_stack_fffffffffffffeff,
                                         CONCAT16(in_stack_fffffffffffffefe,
                                                  CONCAT24(in_stack_fffffffffffffefc,
                                                           in_stack_fffffffffffffef8))),0);
      } while (iVar6 == 0);
      local_4 = -1;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = js_parse_error((JSParseState *)in_RDI,"invalid assignment syntax");
  }
  return local_4;
}

Assistant:

static int js_parse_destructuring_element(JSParseState *s, int tok, int is_arg,
                                        int hasval, int has_ellipsis,
                                        BOOL allow_initializer)
{
    int label_parse, label_assign, label_done, label_lvalue, depth_lvalue;
    int start_addr, assign_addr;
    JSAtom prop_name, var_name;
    int opcode, scope, tok1, skip_bits;
    BOOL has_initializer;
    
    if (has_ellipsis < 0) {
        /* pre-parse destructuration target for spread detection */
        js_parse_skip_parens_token(s, &skip_bits, FALSE);
        has_ellipsis = skip_bits & SKIP_HAS_ELLIPSIS;
    }

    label_parse = new_label(s);
    label_assign = new_label(s);

    start_addr = s->cur_func->byte_code.size;
    if (hasval) {
        /* consume value from the stack */
        emit_op(s, OP_dup);
        emit_op(s, OP_undefined);
        emit_op(s, OP_strict_eq);
        emit_goto(s, OP_if_true, label_parse);
        emit_label(s, label_assign);
    } else {
        emit_goto(s, OP_goto, label_parse);
        emit_label(s, label_assign);
        /* leave value on the stack */
        emit_op(s, OP_dup);
    }
    assign_addr = s->cur_func->byte_code.size;
    if (s->token.val == '{') {
        if (next_token(s))
            return -1;
        /* throw an exception if the value cannot be converted to an object */
        emit_op(s, OP_to_object);
        if (has_ellipsis) {
            /* add excludeList on stack just below src object */
            emit_op(s, OP_object);
            emit_op(s, OP_swap);
        }
        while (s->token.val != '}') {
            int prop_type;
            if (s->token.val == TOK_ELLIPSIS) {
                if (!has_ellipsis) {
                    JS_ThrowInternalError(s->ctx, "unexpected ellipsis token");
                    return -1;
                }
                if (next_token(s))
                    return -1;
                if (tok) {
                    var_name = js_parse_destructuring_var(s, tok, is_arg);
                    if (var_name == JS_ATOM_NULL)
                        return -1;
                    opcode = OP_scope_get_var;
                    scope = s->cur_func->scope_level;
                    label_lvalue = -1;
                    depth_lvalue = 0;
                } else {
                    if (js_parse_left_hand_side_expr(s))
                        return -1;

                    if (get_lvalue(s, &opcode, &scope, &var_name,
                                   &label_lvalue, &depth_lvalue, FALSE, '{'))
                        return -1;
                }
                if (s->token.val != '}') {
                    js_parse_error(s, "assignment rest property must be last");
                    goto var_error;
                }
                emit_op(s, OP_object);  /* target */
                emit_op(s, OP_copy_data_properties);
                emit_u8(s, 0 | ((depth_lvalue + 1) << 2) | ((depth_lvalue + 2) << 5));
                goto set_val;
            }
            prop_type = js_parse_property_name(s, &prop_name, FALSE, TRUE, FALSE);
            if (prop_type < 0)
                return -1;
            var_name = JS_ATOM_NULL;
            opcode = OP_scope_get_var;
            scope = s->cur_func->scope_level;
            label_lvalue = -1;
            depth_lvalue = 0;
            if (prop_type == PROP_TYPE_IDENT) {
                if (next_token(s))
                    goto prop_error;
                if ((s->token.val == '[' || s->token.val == '{')
                    &&  ((tok1 = js_parse_skip_parens_token(s, &skip_bits, FALSE)) == ',' ||
                         tok1 == '=' || tok1 == '}')) {
                    if (prop_name == JS_ATOM_NULL) {
                        /* computed property name on stack */
                        if (has_ellipsis) {
                            /* define the property in excludeList */
                            emit_op(s, OP_to_propkey); /* avoid calling ToString twice */
                            emit_op(s, OP_perm3); /* TOS: src excludeList prop */
                            emit_op(s, OP_null); /* TOS: src excludeList prop null */
                            emit_op(s, OP_define_array_el); /* TOS: src excludeList prop */
                            emit_op(s, OP_perm3); /* TOS: excludeList src prop */
                        }
                        /* get the computed property from the source object */
                        emit_op(s, OP_get_array_el2);
                    } else {
                        /* named property */
                        if (has_ellipsis) {
                            /* define the property in excludeList */
                            emit_op(s, OP_swap); /* TOS: src excludeList */
                            emit_op(s, OP_null); /* TOS: src excludeList null */
                            emit_op(s, OP_define_field); /* TOS: src excludeList */
                            emit_atom(s, prop_name);
                            emit_op(s, OP_swap); /* TOS: excludeList src */
                        }
                        /* get the named property from the source object */
                        emit_op(s, OP_get_field2);
                        emit_u32(s, prop_name);
                    }
                    if (js_parse_destructuring_element(s, tok, is_arg, TRUE, -1, TRUE) < 0)
                        return -1;
                    if (s->token.val == '}')
                        break;
                    /* accept a trailing comma before the '}' */
                    if (js_parse_expect(s, ','))
                        return -1;
                    continue;
                }
                if (prop_name == JS_ATOM_NULL) {
                    emit_op(s, OP_to_propkey2);
                    if (has_ellipsis) {
                        /* define the property in excludeList */
                        emit_op(s, OP_perm3);
                        emit_op(s, OP_null);
                        emit_op(s, OP_define_array_el);
                        emit_op(s, OP_perm3);
                    }
                    /* source prop -- source source prop */
                    emit_op(s, OP_dup1);
                } else {
                    if (has_ellipsis) {
                        /* define the property in excludeList */
                        emit_op(s, OP_swap);
                        emit_op(s, OP_null);
                        emit_op(s, OP_define_field);
                        emit_atom(s, prop_name);
                        emit_op(s, OP_swap);
                    }
                    /* source -- source source */
                    emit_op(s, OP_dup);
                }
                if (tok) {
                    var_name = js_parse_destructuring_var(s, tok, is_arg);
                    if (var_name == JS_ATOM_NULL)
                        goto prop_error;
                } else {
                    if (js_parse_left_hand_side_expr(s))
                        goto prop_error;
                lvalue:
                    if (get_lvalue(s, &opcode, &scope, &var_name,
                                   &label_lvalue, &depth_lvalue, FALSE, '{'))
                        goto prop_error;
                    /* swap ref and lvalue object if any */
                    if (prop_name == JS_ATOM_NULL) {
                        switch(depth_lvalue) {
                        case 1:
                            /* source prop x -> x source prop */
                            emit_op(s, OP_rot3r);
                            break;
                        case 2:
                            /* source prop x y -> x y source prop */
                            emit_op(s, OP_swap2);   /* t p2 s p1 */
                            break;
                        case 3:
                            /* source prop x y z -> x y z source prop */
                            emit_op(s, OP_rot5l);
                            emit_op(s, OP_rot5l);
                            break;
                        }
                    } else {
                        switch(depth_lvalue) {
                        case 1:
                            /* source x -> x source */
                            emit_op(s, OP_swap);
                            break;
                        case 2:
                            /* source x y -> x y source */
                            emit_op(s, OP_rot3l);
                            break;
                        case 3:
                            /* source x y z -> x y z source */
                            emit_op(s, OP_rot4l);
                            break;
                        }
                    }
                }
                if (prop_name == JS_ATOM_NULL) {
                    /* computed property name on stack */
                    /* XXX: should have OP_get_array_el2x with depth */
                    /* source prop -- val */
                    emit_op(s, OP_get_array_el);
                } else {
                    /* named property */
                    /* XXX: should have OP_get_field2x with depth */
                    /* source -- val */
                    emit_op(s, OP_get_field);
                    emit_u32(s, prop_name);
                }
            } else {
                /* prop_type = PROP_TYPE_VAR, cannot be a computed property */
                if (is_arg && js_parse_check_duplicate_parameter(s, prop_name))
                    goto prop_error;
                if ((s->cur_func->js_mode & JS_MODE_STRICT) &&
                    (prop_name == JS_ATOM_eval || prop_name == JS_ATOM_arguments)) {
                    js_parse_error(s, "invalid destructuring target");
                    goto prop_error;
                }
                if (has_ellipsis) {
                    /* define the property in excludeList */
                    emit_op(s, OP_swap);
                    emit_op(s, OP_null);
                    emit_op(s, OP_define_field);
                    emit_atom(s, prop_name);
                    emit_op(s, OP_swap);
                }
                if (!tok || tok == TOK_VAR) {
                    /* generate reference */
                    /* source -- source source */
                    emit_op(s, OP_dup);
                    emit_op(s, OP_scope_get_var);
                    emit_atom(s, prop_name);
                    emit_u16(s, s->cur_func->scope_level);
                    goto lvalue;
                }
                var_name = JS_DupAtom(s->ctx, prop_name);
                /* source -- source val */
                emit_op(s, OP_get_field2);
                emit_u32(s, prop_name);
            }
        set_val:
            if (tok) {
                if (js_define_var(s, var_name, tok))
                    goto var_error;
                scope = s->cur_func->scope_level;
            }
            if (s->token.val == '=') {  /* handle optional default value */
                int label_hasval;
                emit_op(s, OP_dup);
                emit_op(s, OP_undefined);
                emit_op(s, OP_strict_eq);
                label_hasval = emit_goto(s, OP_if_false, -1);
                if (next_token(s))
                    goto var_error;
                emit_op(s, OP_drop);
                if (js_parse_assign_expr(s))
                    goto var_error;
                if (opcode == OP_scope_get_var || opcode == OP_get_ref_value)
                    set_object_name(s, var_name);
                emit_label(s, label_hasval);
            }
            /* store value into lvalue object */
            put_lvalue(s, opcode, scope, var_name, label_lvalue,
                       PUT_LVALUE_NOKEEP_DEPTH,
                       (tok == TOK_CONST || tok == TOK_LET));
            if (s->token.val == '}')
                break;
            /* accept a trailing comma before the '}' */
            if (js_parse_expect(s, ','))
                return -1;
        }
        /* drop the source object */
        emit_op(s, OP_drop);
        if (has_ellipsis) {
            emit_op(s, OP_drop); /* pop excludeList */
        }
        if (next_token(s))
            return -1;
    } else if (s->token.val == '[') {
        BOOL has_spread;
        int enum_depth;
        BlockEnv block_env;

        if (next_token(s))
            return -1;
        /* the block environment is only needed in generators in case
           'yield' triggers a 'return' */
        push_break_entry(s->cur_func, &block_env,
                         JS_ATOM_NULL, -1, -1, 2);
        block_env.has_iterator = TRUE;
        emit_op(s, OP_for_of_start);
        has_spread = FALSE;
        while (s->token.val != ']') {
            /* get the next value */
            if (s->token.val == TOK_ELLIPSIS) {
                if (next_token(s))
                    return -1;
                if (s->token.val == ',' || s->token.val == ']')
                    return js_parse_error(s, "missing binding pattern...");
                has_spread = TRUE;
            }
            if (s->token.val == ',') {
                /* do nothing, skip the value, has_spread is false */
                emit_op(s, OP_for_of_next);
                emit_u8(s, 0);
                emit_op(s, OP_drop);
                emit_op(s, OP_drop);
            } else if ((s->token.val == '[' || s->token.val == '{')
                   &&  ((tok1 = js_parse_skip_parens_token(s, &skip_bits, FALSE)) == ',' ||
                        tok1 == '=' || tok1 == ']')) {
                if (has_spread) {
                    if (tok1 == '=')
                        return js_parse_error(s, "rest element cannot have a default value");
                    js_emit_spread_code(s, 0);
                } else {
                    emit_op(s, OP_for_of_next);
                    emit_u8(s, 0);
                    emit_op(s, OP_drop);
                }
                if (js_parse_destructuring_element(s, tok, is_arg, TRUE, skip_bits & SKIP_HAS_ELLIPSIS, TRUE) < 0)
                    return -1;
            } else {
                var_name = JS_ATOM_NULL;
                enum_depth = 0;
                if (tok) {
                    var_name = js_parse_destructuring_var(s, tok, is_arg);
                    if (var_name == JS_ATOM_NULL)
                        goto var_error;
                    if (js_define_var(s, var_name, tok))
                        goto var_error;
                    opcode = OP_scope_get_var;
                    scope = s->cur_func->scope_level;
                } else {
                    if (js_parse_left_hand_side_expr(s))
                        return -1;
                    if (get_lvalue(s, &opcode, &scope, &var_name,
                                   &label_lvalue, &enum_depth, FALSE, '[')) {
                        return -1;
                    }
                }
                if (has_spread) {
                    js_emit_spread_code(s, enum_depth);
                } else {
                    emit_op(s, OP_for_of_next);
                    emit_u8(s, enum_depth);
                    emit_op(s, OP_drop);
                }
                if (s->token.val == '=' && !has_spread) {
                    /* handle optional default value */
                    int label_hasval;
                    emit_op(s, OP_dup);
                    emit_op(s, OP_undefined);
                    emit_op(s, OP_strict_eq);
                    label_hasval = emit_goto(s, OP_if_false, -1);
                    if (next_token(s))
                        goto var_error;
                    emit_op(s, OP_drop);
                    if (js_parse_assign_expr(s))
                        goto var_error;
                    if (opcode == OP_scope_get_var || opcode == OP_get_ref_value)
                        set_object_name(s, var_name);
                    emit_label(s, label_hasval);
                }
                /* store value into lvalue object */
                put_lvalue(s, opcode, scope, var_name,
                           label_lvalue, PUT_LVALUE_NOKEEP_DEPTH,
                           (tok == TOK_CONST || tok == TOK_LET));
            }
            if (s->token.val == ']')
                break;
            if (has_spread)
                return js_parse_error(s, "rest element must be the last one");
            /* accept a trailing comma before the ']' */
            if (js_parse_expect(s, ','))
                return -1;
        }
        /* close iterator object:
           if completed, enum_obj has been replaced by undefined */
        emit_op(s, OP_iterator_close);
        pop_break_entry(s->cur_func);
        if (next_token(s))
            return -1;
    } else {
        return js_parse_error(s, "invalid assignment syntax");
    }
    if (s->token.val == '=' && allow_initializer) {
        label_done = emit_goto(s, OP_goto, -1);
        if (next_token(s))
            return -1;
        emit_label(s, label_parse);
        if (hasval)
            emit_op(s, OP_drop);
        if (js_parse_assign_expr(s))
            return -1;
        emit_goto(s, OP_goto, label_assign);
        emit_label(s, label_done);
        has_initializer = TRUE;
    } else {
        /* normally hasval is true except if
           js_parse_skip_parens_token() was wrong in the parsing */
        //        assert(hasval);
        if (!hasval) {
            js_parse_error(s, "too complicated destructuring expression");
            return -1;
        }
        /* remove test and decrement label ref count */
        memset(s->cur_func->byte_code.buf + start_addr, OP_nop,
               assign_addr - start_addr);
        s->cur_func->label_slots[label_parse].ref_count--;
        has_initializer = FALSE;
    }
    return has_initializer;

 prop_error:
    JS_FreeAtom(s->ctx, prop_name);
 var_error:
    JS_FreeAtom(s->ctx, var_name);
    return -1;
}